

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.h
# Opt level: O0

void __thiscall
QOpenGLFunctions::glGenFramebuffers(QOpenGLFunctions *this,GLsizei n,GLuint *framebuffers)

{
  undefined8 in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  
  (**(code **)(*in_RDI + 0x268))(in_ESI,in_RDX);
  return;
}

Assistant:

inline void QOpenGLFunctions::glGenFramebuffers(GLsizei n, GLuint* framebuffers)
{
#if QT_CONFIG(opengles2) && defined(Q_OS_ANDROID)
    ::glGenFramebuffers(n, framebuffers);
#else
    Q_ASSERT(QOpenGLFunctions::isInitialized(d_ptr));
    d_ptr->f.GenFramebuffers(n, framebuffers);
#endif
    Q_OPENGL_FUNCTIONS_DEBUG
}